

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

bool __thiscall
icu_63::RBBITableBuilder::findDuplicateSafeState(RBBITableBuilder *this,IntPair *states)

{
  bool bVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint uVar5;
  uint uVar6;
  UnicodeString *this_00;
  UnicodeString *this_01;
  int32_t duplVal;
  int32_t firstVal;
  int32_t col;
  int32_t numCols;
  bool rowsMatch;
  UnicodeString *duplRow;
  UnicodeString *firstRow;
  int32_t numStates;
  IntPair *states_local;
  RBBITableBuilder *this_local;
  
  iVar3 = UVector::size(this->fSafeTable);
  do {
    if (iVar3 + -1 <= states->first) {
      return false;
    }
    this_00 = (UnicodeString *)UVector::elementAt(this->fSafeTable,states->first);
    states->second = states->first + 1;
    while (states->second < iVar3) {
      this_01 = (UnicodeString *)UVector::elementAt(this->fSafeTable,states->second);
      bVar1 = true;
      iVar4 = UnicodeString::length(this_00);
      for (duplVal = 0; duplVal < iVar4; duplVal = duplVal + 1) {
        cVar2 = UnicodeString::charAt(this_00,duplVal);
        uVar5 = (uint)(ushort)cVar2;
        cVar2 = UnicodeString::charAt(this_01,duplVal);
        uVar6 = (uint)(ushort)cVar2;
        if ((uVar5 != uVar6) &&
           (((uVar5 != states->first && (uVar5 != states->second)) ||
            ((uVar6 != states->first && (uVar6 != states->second)))))) {
          bVar1 = false;
          break;
        }
      }
      if (bVar1) {
        return true;
      }
      states->second = states->second + 1;
    }
    states->first = states->first + 1;
  } while( true );
}

Assistant:

bool RBBITableBuilder::findDuplicateSafeState(IntPair *states) {
    int32_t numStates = fSafeTable->size();

    for (; states->first<numStates-1; states->first++) {
        UnicodeString *firstRow = static_cast<UnicodeString *>(fSafeTable->elementAt(states->first));
        for (states->second=states->first+1; states->second<numStates; states->second++) {
            UnicodeString *duplRow = static_cast<UnicodeString *>(fSafeTable->elementAt(states->second));
            bool rowsMatch = true;
            int32_t numCols = firstRow->length();
            for (int32_t col=0; col < numCols; ++col) {
                int32_t firstVal = firstRow->charAt(col);
                int32_t duplVal = duplRow->charAt(col);
                if (!((firstVal == duplVal) ||
                        ((firstVal == states->first || firstVal == states->second) &&
                        (duplVal  == states->first || duplVal  == states->second)))) {
                    rowsMatch = false;
                    break;
                }
            }
            if (rowsMatch) {
                return true;
            }
        }
    }
    return false;
}